

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_unit.cpp
# Opt level: O2

void anon_unknown.dwarf_897d::test_art_iterator_lower_bound(void **param_1)

{
  _Bool _Var1;
  size_t i;
  ulong uVar2;
  initializer_list<const_char_*> __l;
  initializer_list<unsigned_long> __l_00;
  initializer_list<const_char_*> __l_01;
  initializer_list<unsigned_long> __l_02;
  initializer_list<const_char_*> __l_03;
  initializer_list<unsigned_long> __l_04;
  vector<const_char_*,_std::allocator<const_char_*>_> keys;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  art_iterator_t iterator;
  art_t art;
  
  art_init_cleared((art_t *)&art);
  art_init_iterator((art_iterator_t *)&iterator,(art_t *)&art,true);
  _assert_true((ulong)(iterator.value == (art_val_t *)0x0),"iterator.value",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
               ,0x14a);
  _Var1 = art_iterator_lower_bound((art_iterator_t *)&iterator,(art_key_chunk_t *)"000000");
  _assert_true((ulong)!_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)\"000000\")",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
               ,0x14c);
  _Var1 = art_iterator_lower_bound((art_iterator_t *)&iterator,(art_key_chunk_t *)"000001");
  _assert_true((ulong)!_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)\"000001\")",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
               ,0x14e);
  art_free((art_t *)&art);
  art.first_free[3] = (uint64_t)anon_var_dwarf_196;
  art.first_free[1] = (uint64_t)anon_var_dwarf_182;
  art.first_free[2] = (uint64_t)anon_var_dwarf_18c;
  art.root = (art_ref_t)anon_var_dwarf_162;
  art.first_free[0] = (uint64_t)anon_var_dwarf_178;
  __l._M_len = 5;
  __l._M_array = (iterator)&art;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&keys,__l,(allocator_type *)&iterator);
  art.first_free[1] = 3;
  art.first_free[2] = 4;
  art.root = 1;
  art.first_free[0] = 2;
  art.first_free[3] = 5;
  __l_00._M_len = 5;
  __l_00._M_array = &art.root;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&values,__l_00,(allocator_type *)&iterator);
  art_init_cleared((art_t *)&art);
  for (uVar2 = 0;
      uVar2 < (ulong)((long)keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3); uVar2 = uVar2 + 1) {
    art_insert((art_t *)&art,
               (art_key_chunk_t *)
               keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar2],
               values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar2]);
    assert_art_valid(&art);
  }
  art_init_iterator((art_iterator_t *)&iterator,(art_t *)&art,true);
  _Var1 = art_iterator_lower_bound
                    ((art_iterator_t *)&iterator,
                     (art_key_chunk_t *)
                     keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                     super__Vector_impl_data._M_start[2]);
  _assert_true((ulong)_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)keys[2])",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
               ,0x15f);
  assert_key_eq(iterator.key,
                (art_key_chunk_t *)
                keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start[2]);
  _Var1 = art_iterator_lower_bound((art_iterator_t *)&iterator,(art_key_chunk_t *)"000005");
  _assert_true((ulong)_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
               ,0x162);
  assert_key_eq(iterator.key,
                (art_key_chunk_t *)
                keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start[4]);
  art_free((art_t *)&art);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  art.first_free[1] = (uint64_t)anon_var_dwarf_18c;
  art.first_free[2] = (uint64_t)anon_var_dwarf_196;
  art.root = (art_ref_t)anon_var_dwarf_162;
  art.first_free[0] = (uint64_t)anon_var_dwarf_182;
  __l_01._M_len = 4;
  __l_01._M_array = (iterator)&art;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&keys,__l_01,(allocator_type *)&iterator);
  art.first_free[1] = 4;
  art.first_free[2] = 5;
  art.root = 1;
  art.first_free[0] = 3;
  __l_02._M_len = 4;
  __l_02._M_array = &art.root;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&values,__l_02,(allocator_type *)&iterator);
  art_init_cleared((art_t *)&art);
  for (uVar2 = 0;
      uVar2 < (ulong)((long)keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3); uVar2 = uVar2 + 1) {
    art_insert((art_t *)&art,
               (art_key_chunk_t *)
               keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar2],
               values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar2]);
    assert_art_valid(&art);
  }
  art_init_iterator((art_iterator_t *)&iterator,(art_t *)&art,true);
  _Var1 = art_iterator_lower_bound((art_iterator_t *)&iterator,(art_key_chunk_t *)"000002");
  _assert_true((ulong)_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
               ,0x175);
  assert_key_eq(iterator.key,
                (art_key_chunk_t *)
                keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start[1]);
  _Var1 = art_iterator_lower_bound((art_iterator_t *)&iterator,(art_key_chunk_t *)"000001");
  _assert_true((ulong)_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key2)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
               ,0x17b);
  assert_key_eq(iterator.key,
                (art_key_chunk_t *)
                *keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_start);
  art_free((art_t *)&art);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  art.first_free[1] = (uint64_t)anon_var_dwarf_348;
  art.root = (art_ref_t)anon_var_dwarf_332;
  art.first_free[0] = (uint64_t)anon_var_dwarf_33d;
  __l_03._M_len = 3;
  __l_03._M_array = (iterator)&art;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&keys,__l_03,(allocator_type *)&iterator);
  art.root = 1;
  art.first_free[0] = 2;
  art.first_free[1] = 3;
  __l_04._M_len = 3;
  __l_04._M_array = &art.root;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&values,__l_04,(allocator_type *)&iterator);
  art_init_cleared((art_t *)&art);
  for (uVar2 = 0;
      uVar2 < (ulong)((long)keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3); uVar2 = uVar2 + 1) {
    art_insert((art_t *)&art,
               (art_key_chunk_t *)
               keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar2],
               values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar2]);
    assert_art_valid(&art);
  }
  art_init_iterator((art_iterator_t *)&iterator,(art_t *)&art,true);
  _Var1 = art_iterator_lower_bound((art_iterator_t *)&iterator,(art_key_chunk_t *)"000201");
  _assert_true((ulong)_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
               ,400);
  assert_key_eq(iterator.key,
                (art_key_chunk_t *)
                keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start[2]);
  _Var1 = art_iterator_lower_bound((art_iterator_t *)&iterator,(art_key_chunk_t *)"000099");
  _assert_true((ulong)_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
               ,0x197);
  assert_key_eq(iterator.key,
                (art_key_chunk_t *)
                *keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_start);
  _Var1 = art_iterator_lower_bound((art_iterator_t *)&iterator,(art_key_chunk_t *)"000300");
  _assert_true((ulong)_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
               ,0x19e);
  assert_key_eq(iterator.key,
                (art_key_chunk_t *)
                keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start[2]);
  _Var1 = art_iterator_next((art_iterator_t *)&iterator);
  _assert_true((ulong)!_Var1,"art_iterator_next(&iterator)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
               ,0x1a0);
  _Var1 = art_iterator_lower_bound((art_iterator_t *)&iterator,(art_key_chunk_t *)"000300");
  _assert_true((ulong)_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
               ,0x1a2);
  assert_key_eq(iterator.key,
                (art_key_chunk_t *)
                keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start[2]);
  _Var1 = art_iterator_lower_bound((art_iterator_t *)&iterator,(art_key_chunk_t *)"000100");
  _assert_true((ulong)_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
               ,0x1a9);
  assert_key_eq(iterator.key,
                (art_key_chunk_t *)
                *keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_start);
  _Var1 = art_iterator_prev((art_iterator_t *)&iterator);
  _assert_true((ulong)!_Var1,"art_iterator_prev(&iterator)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
               ,0x1ab);
  _Var1 = art_iterator_lower_bound((art_iterator_t *)&iterator,(art_key_chunk_t *)"000100");
  _assert_true((ulong)_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
               ,0x1ad);
  assert_key_eq(iterator.key,
                (art_key_chunk_t *)
                *keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_start);
  art_free((art_t *)&art);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  art_init_cleared((art_t *)&art);
  art_insert((art_t *)&art,(art_key_chunk_t *)"000001",1);
  art_init_iterator((art_iterator_t *)&iterator,(art_t *)&art,true);
  _Var1 = art_iterator_lower_bound((art_iterator_t *)&iterator,(art_key_chunk_t *)"000001");
  _assert_true((ulong)_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
               ,0x1be);
  assert_key_eq((art_key_chunk_t *)&iterator,(art_key_chunk_t *)"000001");
  _Var1 = art_iterator_lower_bound((art_iterator_t *)&iterator,(art_key_chunk_t *)"000000");
  _assert_true((ulong)_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key2)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
               ,0x1c3);
  assert_key_eq((art_key_chunk_t *)&iterator,(art_key_chunk_t *)"000001");
  _Var1 = art_iterator_lower_bound((art_iterator_t *)&iterator,(art_key_chunk_t *)"000002");
  _assert_true((ulong)!_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key3)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
               ,0x1c8);
  art_free((art_t *)&art);
  return;
}

Assistant:

DEFINE_TEST(test_art_iterator_lower_bound) {
    {
        art_t art;
        art_init_cleared(&art);
        art_iterator_t iterator = art_init_iterator(&art, true);
        assert_null(iterator.value);
        assert_false(
            art_iterator_lower_bound(&iterator, (art_key_chunk_t*)"000000"));
        assert_false(
            art_iterator_lower_bound(&iterator, (art_key_chunk_t*)"000001"));
        art_free(&art);
    }
    {
        std::vector<const char*> keys = {
            "000001", "000002", "000003", "000004", "001005",
        };
        std::vector<art_val_t> values = {1, 2, 3, 4, 5};
        art_t art;
        art_init_cleared(&art);
        for (size_t i = 0; i < keys.size(); ++i) {
            art_insert(&art, (art_key_chunk_t*)keys[i], values[i]);
            assert_art_valid(&art);
        }

        art_iterator_t iterator = art_init_iterator(&art, true);
        assert_true(
            art_iterator_lower_bound(&iterator, (art_key_chunk_t*)keys[2]));
        assert_key_eq(iterator.key, (art_key_chunk_t*)keys[2]);
        const char* key = "000005";
        assert_true(art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key));
        assert_key_eq(iterator.key, (art_key_chunk_t*)keys[4]);
        art_free(&art);
    }
    {
        // Lower bound search within a node's children.
        std::vector<const char*> keys = {"000001", "000003", "000004",
                                         "001005"};
        std::vector<art_val_t> values = {1, 3, 4, 5};
        art_t art;
        art_init_cleared(&art);
        for (size_t i = 0; i < keys.size(); ++i) {
            art_insert(&art, (art_key_chunk_t*)keys[i], values[i]);
            assert_art_valid(&art);
        }
        art_iterator_t iterator = art_init_iterator(&art, true);

        const char* key1 = "000002";
        assert_true(
            art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key1));
        assert_key_eq(iterator.key, (art_key_chunk_t*)keys[1]);

        // Check that we can go backward within a node's children.
        const char* key2 = "000001";
        assert_true(
            art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key2));
        assert_key_eq(iterator.key, (art_key_chunk_t*)keys[0]);

        art_free(&art);
    }
    {
        // Lower bound search with leaf where prefix is equal but full key is
        // smaller.
        std::vector<const char*> keys = {"000100", "000200", "000300"};
        std::vector<art_val_t> values = {1, 2, 3};
        art_t art;
        art_init_cleared(&art);
        for (size_t i = 0; i < keys.size(); ++i) {
            art_insert(&art, (art_key_chunk_t*)keys[i], values[i]);
            assert_art_valid(&art);
        }
        art_iterator_t iterator = art_init_iterator(&art, true);

        {
            const char* key = "000201";
            assert_true(
                art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key));
            assert_key_eq(iterator.key, (art_key_chunk_t*)keys[2]);
        }
        {
            // Check that we can go backward.
            const char* key = "000099";
            assert_true(
                art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key));
            assert_key_eq(iterator.key, (art_key_chunk_t*)keys[0]);
        }
        {
            // Check that we can go backward from after the end.
            const char* key = "000300";
            assert_true(
                art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key));
            assert_key_eq(iterator.key, (art_key_chunk_t*)keys[2]);
            assert_false(art_iterator_next(&iterator));
            assert_true(
                art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key));
            assert_key_eq(iterator.key, (art_key_chunk_t*)keys[2]);
        }
        {
            // Check that we can go forward from before the start.
            const char* key = "000100";
            assert_true(
                art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key));
            assert_key_eq(iterator.key, (art_key_chunk_t*)keys[0]);
            assert_false(art_iterator_prev(&iterator));
            assert_true(
                art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key));
            assert_key_eq(iterator.key, (art_key_chunk_t*)keys[0]);
        }

        art_free(&art);
    }
    {
        // Lower bound search with only a single leaf.
        const char* key1 = "000001";
        art_val_t value{1};
        art_t art;
        art_init_cleared(&art);
        art_insert(&art, (art_key_chunk_t*)key1, value);

        art_iterator_t iterator = art_init_iterator(&art, true);

        assert_true(
            art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key1));
        assert_key_eq(iterator.key, (art_key_chunk_t*)key1);

        const char* key2 = "000000";
        assert_true(
            art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key2));
        assert_key_eq(iterator.key, (art_key_chunk_t*)key1);

        const char* key3 = "000002";
        assert_false(
            art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key3));

        art_free(&art);
    }
}